

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::GenerateCommonBuilderMethods
          (MessageBuilderLiteGenerator *this,Printer *printer)

{
  string_view text;
  string local_30;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_30,this->name_resolver_,this->descriptor_);
  text._M_str = 
  "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  super(DEFAULT_INSTANCE);\n}\n\n"
  ;
  text._M_len = 0x5e;
  io::Printer::Print<char[10],std::__cxx11::string>(printer,text,(char (*) [10])0x475c54,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void MessageBuilderLiteGenerator::GenerateCommonBuilderMethods(
    io::Printer* printer) {
  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "  super(DEFAULT_INSTANCE);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
}